

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjunctiveMonotone.c
# Opt level: O3

Vec_Int_t * vectorDifference(Vec_Int_t *A,Vec_Int_t *B)

{
  int iVar1;
  Vec_Int_t *p;
  long lVar2;
  long lVar3;
  
  p = (Vec_Int_t *)calloc(1,0x10);
  iVar1 = A->nSize;
  if (0 < iVar1) {
    lVar3 = 0;
    do {
      if (0 < (long)B->nSize) {
        lVar2 = 0;
        do {
          if (B->pArray[lVar2] == A->pArray[lVar3]) goto LAB_005b801f;
          lVar2 = lVar2 + 1;
        } while (B->nSize != lVar2);
      }
      Vec_IntPush(p,A->pArray[lVar3]);
      iVar1 = A->nSize;
LAB_005b801f:
      lVar3 = lVar3 + 1;
    } while (lVar3 < iVar1);
  }
  return p;
}

Assistant:

Vec_Int_t *vectorDifference(Vec_Int_t *A, Vec_Int_t *B)
{
	Vec_Int_t *C;
	int iElem, i;

	C = Vec_IntAlloc(0);
	Vec_IntForEachEntry( A, iElem, i )
	{
		if( Vec_IntFind( B, iElem ) == -1 )
		{
			Vec_IntPush( C, iElem );
		}
	}

	return C;
}